

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O3

bool __thiscall ftxui::anon_unknown_3::ButtonBase::OnEvent(ButtonBase *this,Event *event)

{
  bool bVar1;
  _func_int **local_20;
  
  if ((event->type_ == Mouse) &&
     (bVar1 = Box::Contain(&this->box_,(event->field_1).mouse_.x,(event->field_1).mouse_.y), bVar1))
  {
    ComponentBase::CaptureMouse((ComponentBase *)&stack0xffffffffffffffe0,(Event *)this);
    if (local_20 != (_func_int **)0x0) {
      (**(code **)(*local_20 + 8))();
      ComponentBase::TakeFocus(&this->super_ComponentBase);
      if (((event->field_1).mouse_.button == Left) && ((event->field_1).mouse_.motion == Pressed))
      goto LAB_0013a17d;
    }
  }
  else {
    bVar1 = Event::operator==(event,(Event *)Event::Return);
    if (bVar1) {
LAB_0013a17d:
      if ((this->on_click_).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->on_click_)._M_invoker)((_Any_data *)&this->on_click_);
        return true;
      }
      std::__throw_bad_function_call();
    }
  }
  return false;
}

Assistant:

bool OnEvent(Event event) override {
    if (event.is_mouse() && box_.Contain(event.mouse().x, event.mouse().y)) {
      if (!CaptureMouse(event))
        return false;

      TakeFocus();

      if (event.mouse().button == Mouse::Left &&
          event.mouse().motion == Mouse::Pressed) {
        on_click_();
        return true;
      }

      return false;
    }

    if (event == Event::Return) {
      on_click_();
      return true;
    }
    return false;
  }